

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O3

string * __thiscall
Json::JsonParser::resolve_escape_hex_unicode_abi_cxx11_
          (string *__return_storage_ptr__,JsonParser *this)

{
  char *__s;
  char cVar1;
  size_t sVar2;
  int iVar3;
  int unicodeC;
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert;
  stringstream ss;
  char16_t local_210 [2];
  char16_t local_20c [2];
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  local_208;
  stringstream local_1a8 [16];
  long local_198 [3];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  (this->__buffer_value)._M_string_length = 0;
  *(this->__buffer_value)._M_dataplus._M_p = '\0';
  iVar3 = 4;
  do {
    cVar1 = JsonReader::get(&this->__reader);
    if (0x36 < (byte)(cVar1 - 0x30U)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    std::__cxx11::string::_M_replace_aux
              ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  std::__cxx11::stringstream::stringstream(local_1a8);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
  __s = (this->__buffer_value)._M_dataplus._M_p;
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
  }
  std::istream::operator>>((istream *)local_1a8,(int *)local_210);
  local_208._M_cvt._M_t.
  super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
  .
  super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>,_true,_true>
        )operator_new(0x20);
  *(undefined4 *)
   ((long)local_208._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 8) = 0;
  *(uleb128 **)
   ((long)local_208._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 0x10) = &uleb128_0010ffff;
  *(undefined4 *)
   ((long)local_208._M_cvt._M_t.
          super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
          .
          super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
          ._M_head_impl + 0x18) = 0;
  *(undefined ***)
   local_208._M_cvt._M_t.
   super___uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
   .
   super__Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
   ._M_head_impl = &PTR____codecvt_utf8_utf16_base_00112cf0;
  local_208._M_byte_err_string._M_dataplus._M_p = (pointer)&local_208._M_byte_err_string.field_2;
  local_208._M_byte_err_string._M_string_length = 0;
  local_208._M_byte_err_string.field_2._M_local_buf[0] = '\0';
  local_208._M_wide_err_string._M_dataplus._M_p = (pointer)&local_208._M_wide_err_string.field_2;
  local_208._M_wide_err_string._M_string_length = 0;
  local_208._M_wide_err_string.field_2._M_local_buf[0] = L'\0';
  local_208._M_state.__count = 0;
  local_208._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_208._M_count = 0;
  local_208._M_with_cvtstate = false;
  local_208._M_with_strings = false;
  local_20c[0] = local_210[0];
  local_20c[1] = 0;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,&local_208,local_20c,local_20c + 1);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_208);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string Json::JsonParser::resolve_escape_hex_unicode() {
    buffer_reset();
    for (int i = 0; i < 4; i++) {
        char c = __reader.get();
        if (!is_hex(c)) return "";
        buffer_append(c);
    }
    std::stringstream ss;
    int unicodeC;
    ss << std::hex << buffer_str();
    ss >> unicodeC;
    std::wstring_convert<std::codecvt_utf8_utf16<char16_t>, char16_t> convert;
    return convert.to_bytes(unicodeC);
}